

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend
          (SnappyScatteredWriter<snappy::SnappySinkAllocator> *this,char *ip,size_t len)

{
  unsigned_long *puVar1;
  char *pcVar2;
  unsigned_long local_40;
  unsigned_long local_38;
  size_t bsize;
  size_t avail;
  size_t len_local;
  char *ip_local;
  SnappyScatteredWriter<snappy::SnappySinkAllocator> *this_local;
  
  bsize = (long)this->op_limit_ - (long)this->op_ptr_;
  avail = len;
  len_local = (size_t)ip;
  ip_local = (char *)this;
  while( true ) {
    if (avail <= bsize) {
      memcpy(this->op_ptr_,(void *)len_local,avail);
      this->op_ptr_ = this->op_ptr_ + avail;
      return true;
    }
    memcpy(this->op_ptr_,(void *)len_local,bsize);
    this->op_ptr_ = this->op_ptr_ + bsize;
    if (this->op_limit_ != this->op_ptr_) break;
    this->full_size_ = (size_t)(this->op_ptr_ + (this->full_size_ - (long)this->op_base_));
    avail = avail - bsize;
    len_local = bsize + len_local;
    if (this->expected_ < this->full_size_ + avail) {
      return false;
    }
    local_40 = this->expected_ - this->full_size_;
    puVar1 = std::min<unsigned_long>(&kBlockSize,&local_40);
    local_38 = *puVar1;
    pcVar2 = SnappySinkAllocator::Allocate(&this->allocator_,(int)local_38);
    this->op_base_ = pcVar2;
    this->op_ptr_ = this->op_base_;
    this->op_limit_ = this->op_base_ + local_38;
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->blocks_,&this->op_base_);
    bsize = local_38;
  }
  __assert_fail("op_limit_ - op_ptr_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/snappy/snappy.cc"
                ,0x5df,
                "bool snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend(const char *, size_t) [Allocator = snappy::SnappySinkAllocator]"
               );
}

Assistant:

bool SnappyScatteredWriter<Allocator>::SlowAppend(const char* ip, size_t len) {
  size_t avail = op_limit_ - op_ptr_;
  while (len > avail) {
    // Completely fill this block
    memcpy(op_ptr_, ip, avail);
    op_ptr_ += avail;
    assert(op_limit_ - op_ptr_ == 0);
    full_size_ += (op_ptr_ - op_base_);
    len -= avail;
    ip += avail;

    // Bounds check
    if (full_size_ + len > expected_) {
      return false;
    }

    // Make new block
    size_t bsize = std::min<size_t>(kBlockSize, expected_ - full_size_);
    op_base_ = allocator_.Allocate(bsize);
    op_ptr_ = op_base_;
    op_limit_ = op_base_ + bsize;
    blocks_.push_back(op_base_);
    avail = bsize;
  }

  memcpy(op_ptr_, ip, len);
  op_ptr_ += len;
  return true;
}